

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O0

void __thiscall
duckdb::ExportAggregateBindData::ExportAggregateBindData
          (ExportAggregateBindData *this,AggregateFunction *aggr_p,idx_t state_size_p)

{
  _func_int **in_RDX;
  FunctionData *in_RDI;
  AggregateFunction *in_stack_ffffffffffffffd8;
  AggregateFunction *in_stack_ffffffffffffffe0;
  
  FunctionData::FunctionData(in_RDI);
  in_RDI->_vptr_FunctionData = (_func_int **)&PTR__ExportAggregateBindData_0351cd68;
  AggregateFunction::AggregateFunction(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0x27]._vptr_FunctionData = in_RDX;
  return;
}

Assistant:

explicit ExportAggregateBindData(AggregateFunction aggr_p, idx_t state_size_p)
	    : aggr(std::move(aggr_p)), state_size(state_size_p) {
	}